

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1090908::cmBlockFunctionBlocker::Replay
          (cmBlockFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables;
  pointer lff;
  cmExecutionStatus status;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e0;
  bool local_c0;
  cmExecutionStatus local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  lff = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (lff != pcVar2) {
    this_00 = inStatus->Makefile;
    paVar1 = &local_b8.Error.field_2;
    do {
      variables = &local_b8.Variables;
      local_b8.Error.field_2._8_6_ = 0x2e726f727265;
      local_b8.Error.field_2._M_allocated_capacity._0_6_ = 0x776f6e6b6e75;
      local_b8.Error.field_2._M_allocated_capacity._6_2_ = 0x206e;
      local_b8.Error._M_string_length = 0xe;
      local_b8.Error.field_2._M_local_buf[0xe] = '\0';
      local_b8.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
      local_b8.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.ReturnInvoked = false;
      local_b8.BreakInvoked = false;
      local_b8.ContinueInvoked = false;
      local_b8.NestedError = false;
      local_c0 = false;
      local_b8.Makefile = this_00;
      local_b8.Error._M_dataplus._M_p = (pointer)paVar1;
      cmMakefile::ExecuteCommand
                (this_00,lff,&local_b8,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0);
      if ((local_c0 == true) &&
         (local_c0 = false,
         local_e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e0._M_value + 0x10))) {
        operator_delete((void *)local_e0._M_value._M_dataplus._M_p,local_e0._16_8_ + 1);
      }
      if (local_b8.ReturnInvoked == true) {
        cmMakefile::RaiseScope(this_00,variables);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_68,variables);
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (inStatus->Variables).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (inStatus->Variables).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        inStatus->ReturnInvoked = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
LAB_0037a859:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(variables);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8.Error._M_dataplus._M_p == paVar1) {
          return true;
        }
        operator_delete(local_b8.Error._M_dataplus._M_p,
                        CONCAT26(local_b8.Error.field_2._M_allocated_capacity._6_2_,
                                 local_b8.Error.field_2._M_allocated_capacity._0_6_) + 1);
        return true;
      }
      if (local_b8.BreakInvoked == true) {
        inStatus->BreakInvoked = true;
        goto LAB_0037a859;
      }
      if (local_b8.ContinueInvoked == true) {
        inStatus->ContinueInvoked = true;
        goto LAB_0037a859;
      }
      if (local_b8.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged == true) {
        (inStatus->ExitCode).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_payload_base<int>)
             ((ulong)(uint)local_b8.ExitCode.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>._M_payload._M_value | 0x100000000);
        goto LAB_0037a859;
      }
      if ((cmSystemTools::s_FatalErrorOccurred != false) ||
         (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) {
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8.Variables);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.Error._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8.Error._M_dataplus._M_p,
                        CONCAT26(local_b8.Error.field_2._M_allocated_capacity._6_2_,
                                 local_b8.Error.field_2._M_allocated_capacity._0_6_) + 1);
      }
      lff = lff + 1;
    } while (!bVar3 && lff != pcVar2);
  }
  return true;
}

Assistant:

bool cmBlockFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                    cmExecutionStatus& inStatus)
{
  auto& mf = inStatus.GetMakefile();

  // Invoke all the functions that were collected in the block.
  for (cmListFileFunction const& fn : functions) {
    cmExecutionStatus status(mf);
    mf.ExecuteCommand(fn, status);
    if (status.GetReturnInvoked()) {
      mf.RaiseScope(status.GetReturnVariables());
      inStatus.SetReturnInvoked(status.GetReturnVariables());
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
    if (status.GetContinueInvoked()) {
      inStatus.SetContinueInvoked();
      return true;
    }
    if (status.HasExitCode()) {
      inStatus.SetExitCode(status.GetExitCode());
      return true;
    }
    if (cmSystemTools::GetFatalErrorOccurred()) {
      return true;
    }
  }
  return true;
}